

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

void __thiscall Diligent::RefCountersImpl::~RefCountersImpl(RefCountersImpl *this)

{
  string msg;
  string local_20;
  
  if (((this->m_NumStrongReferences).super___atomic_base<int>._M_i != 0) ||
     ((this->m_NumWeakReferences).super___atomic_base<int>._M_i != 0)) {
    FormatString<char[65]>
              (&local_20,
               (char (*) [65])"There exist outstanding references to the object being destroyed");
    DebugAssertionFailed
              (local_20._M_dataplus._M_p,"~RefCountersImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x1cb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_20._M_dataplus._M_p != &local_20.field_2) {
      operator_delete(local_20._M_dataplus._M_p,local_20.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

~RefCountersImpl()
    {
        VERIFY(m_NumStrongReferences.load() == 0 && m_NumWeakReferences.load() == 0,
               "There exist outstanding references to the object being destroyed");
    }